

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O2

vector<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_> *
__thiscall
TgBot::TgTypeParser::parseJsonAndGetArray<TgBot::Message>
          (vector<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_>
           *__return_storage_ptr__,TgTypeParser *this,JsonToTgTypeFunc<TgBot::Message> parseFunc,
          ptree *data)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  code *pcVar4;
  long in_R8;
  long lVar5;
  shared_ptr<TgBot::Message> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<TgBot::Message>,_std::allocator<std::shared_ptr<TgBot::Message>_>_>::
  reserve(__return_storage_ptr__,*(size_type *)(*(long *)(in_R8 + 0x20) + 0x18));
  lVar2 = *(long *)(*(long *)(in_R8 + 0x20) + 8);
  lVar3 = *(long *)(lVar2 + 0x68);
  lVar5 = lVar3 + -0x60;
  if (lVar3 == 0) {
    lVar5 = 0;
  }
  while (lVar5 != lVar2) {
    pcVar4 = (code *)parseFunc;
    if ((parseFunc & 1) != 0) {
      pcVar4 = *(code **)(*(long *)(this + (long)data) + -1 + parseFunc);
    }
    (*pcVar4)(&local_40,this + (long)data,lVar5 + 0x20);
    std::vector<std::shared_ptr<TgBot::Message>,std::allocator<std::shared_ptr<TgBot::Message>>>::
    emplace_back<std::shared_ptr<TgBot::Message>>
              ((vector<std::shared_ptr<TgBot::Message>,std::allocator<std::shared_ptr<TgBot::Message>>>
                *)__return_storage_ptr__,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    plVar1 = (long *)(lVar5 + 0x68);
    lVar5 = *plVar1 + -0x60;
    if (*plVar1 == 0) {
      lVar5 = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<T>> parseJsonAndGetArray(JsonToTgTypeFunc<T> parseFunc, const boost::property_tree::ptree& data) const {
        std::vector<std::shared_ptr<T>> result;
        result.reserve(data.size());
        for (const std::pair<const std::string, boost::property_tree::ptree>& innerTreeItem : data) {
            result.push_back((this->*parseFunc)(innerTreeItem.second));
        }
        return result;
    }